

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O1

void initialize_task_list
               (string *filename,string *download_address,curl_off_t file_size,
               download_status *status)

{
  list<proxy,_std::allocator<proxy>_> *plVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  Task *this;
  _List_node_base *p_Var5;
  undefined8 extraout_RAX;
  void *unaff_R12;
  _List_node_base *p_Var6;
  undefined1 local_60 [40];
  _List_node_base *p_Stack_38;
  
  if ((status->globalProxyList).super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
      _M_size * 0x600000 <= (ulong)file_size) {
    plVar1 = &status->globalProxyList;
    p_Var6 = (plVar1->super__List_base<proxy,_std::allocator<proxy>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var6 != (_List_node_base *)plVar1) {
      paVar3 = &(((proxy *)local_60)->address).field_2;
      do {
        this = (Task *)operator_new(0x68);
        local_60._0_8_ = paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        local_60._32_8_ = p_Var6[3]._M_next;
        p_Stack_38 = p_Var6[3]._M_prev;
        sVar4 = (status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
                _M_node._M_size;
        Task::Task(this,(proxy *)local_60,sVar4 * 0x600000,sVar4 * 0x600000 + 0x600000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._0_8_ != paVar3) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = (_List_node_base *)this;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar2 = &(status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl
                  ._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        Task::execute(this,filename,download_address,&status->taskMessageQueue);
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)plVar1);
    }
    return;
  }
  initialize_task_list();
  operator_delete(unaff_R12,0x68);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
initialize_task_list(const string &filename, const string &download_address, curl_off_t file_size, download_status *status) {
    if (TEST_DOWNLOAD_BYTES * status->globalProxyList.size() > file_size) {
        fprintf(stderr, "file size too small, please decrease proxies.");
        exit(-1);
    }
    for (const proxy &single_proxy:status->globalProxyList) {
        Task *one_initial_task = new Task(single_proxy, status->globalTaskList.size() * TEST_DOWNLOAD_BYTES,
                                          (status->globalTaskList.size() + 1) * TEST_DOWNLOAD_BYTES);
        status->globalTaskList.push_back(one_initial_task);
        one_initial_task->execute(filename, download_address, &status->taskMessageQueue);
    }
}